

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O3

Vec_Int_t * Tas_ManSolveMiterNc(Gia_Man_t *pAig,int nConfs,Vec_Str_t **pvStatus,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  size_t sVar3;
  Vec_Str_t **ppVVar4;
  int iVar5;
  Tas_Man_t *p;
  Vec_Str_t *pVVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  undefined8 *__ptr;
  void *__ptr_00;
  long lVar10;
  long lVar11;
  long lVar12;
  Vec_Int_t *pVVar13;
  int iVar14;
  timespec ts;
  timespec local_80;
  int local_6c;
  Gia_Man_t *local_68;
  Vec_Int_t *local_60;
  Tas_Man_t *local_58;
  Vec_Int_t *local_50;
  long local_48;
  Vec_Str_t **local_40;
  undefined8 *local_38;
  
  local_6c = fVerbose;
  local_40 = pvStatus;
  iVar5 = clock_gettime(3,&local_80);
  if (iVar5 < 0) {
    local_48 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
    local_48 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_80.tv_sec * -1000000;
  }
  if (pAig->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                  ,0x5f9,"Vec_Int_t *Tas_ManSolveMiterNc(Gia_Man_t *, int, Vec_Str_t **, int)");
  }
  Gia_ManCreateRefs(pAig);
  Gia_ManCleanMark0(pAig);
  Gia_ManCleanMark1(pAig);
  Gia_ManFillValue(pAig);
  Gia_ManCleanPhase(pAig);
  p = Tas_ManAlloc(pAig,nConfs);
  p->pAig = pAig;
  pVVar13 = pAig->vCos;
  iVar14 = pVVar13->nSize - pAig->nRegs;
  pVVar6 = (Vec_Str_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar14 - 1U) {
    iVar5 = iVar14;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar5;
  if (iVar5 == 0) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = (char *)malloc((long)iVar5);
  }
  pVVar6->pArray = pcVar7;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 10000;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(40000);
  pVVar8->pArray = piVar9;
  local_60 = pVVar8;
  __ptr = (undefined8 *)malloc(0x10);
  *__ptr = 100;
  __ptr_00 = malloc(400);
  __ptr[1] = __ptr_00;
  if (0 < pVVar13->nSize) {
    local_50 = p->vModel;
    lVar10 = 0;
    local_68 = pAig;
    local_58 = p;
    local_38 = __ptr;
    do {
      iVar5 = pVVar13->pArray[lVar10];
      if (((long)iVar5 < 0) || (pAig->nObjs <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = pAig->pObjs + iVar5;
      local_50->nSize = 0;
      iVar5 = (int)lVar10;
      if ((~*(ulong *)(pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)) &
          0x1fffffff1fffffff) == 0) {
        if (((uint)*(undefined8 *)pGVar1 >> 0x1d & 1) == 0) {
          uVar2 = pVVar6->nSize;
          if (uVar2 == pVVar6->nCap) {
            if ((int)uVar2 < 0x10) {
              if (pVVar6->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
              }
              pVVar6->pArray = pcVar7;
              pVVar6->nCap = 0x10;
            }
            else {
              sVar3 = (ulong)uVar2 * 2;
              if (pVVar6->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar3);
              }
              else {
                pcVar7 = (char *)realloc(pVVar6->pArray,sVar3);
              }
              pVVar6->pArray = pcVar7;
              pVVar6->nCap = (int)sVar3;
            }
          }
          else {
            pcVar7 = pVVar6->pArray;
          }
          pVVar6->nSize = uVar2 + 1;
          pcVar7[(int)uVar2] = '\x01';
          p = local_58;
        }
        else {
          Cec_ManSatAddToStore(local_60,local_50,iVar5);
          uVar2 = pVVar6->nSize;
          if (uVar2 == pVVar6->nCap) {
            if ((int)uVar2 < 0x10) {
              if (pVVar6->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
              }
              pVVar6->pArray = pcVar7;
              pVVar6->nCap = 0x10;
            }
            else {
              sVar3 = (ulong)uVar2 * 2;
              if (pVVar6->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar3);
              }
              else {
                pcVar7 = (char *)realloc(pVVar6->pArray,sVar3);
              }
              pVVar6->pArray = pcVar7;
              pVVar6->nCap = (int)sVar3;
            }
          }
          else {
            pcVar7 = pVVar6->pArray;
          }
          pVVar6->nSize = uVar2 + 1;
          pcVar7[(int)uVar2] = '\0';
          p = local_58;
        }
      }
      else {
        iVar14 = clock_gettime(3,&local_80);
        if (iVar14 < 0) {
          lVar11 = 1;
        }
        else {
          lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
          lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_80.tv_sec * -1000000;
        }
        (p->Pars).fUseHighest = 1;
        (p->Pars).fUseLowest = 0;
        iVar14 = Tas_ManSolve(p,(Gia_Obj_t *)
                                ((ulong)((uint)*(undefined8 *)pGVar1 >> 0x1d & 1) ^
                                (ulong)(pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff))
                                ),(Gia_Obj_t *)0x0);
        uVar2 = pVVar6->nSize;
        if (uVar2 == pVVar6->nCap) {
          if ((int)uVar2 < 0x10) {
            if (pVVar6->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
            }
            pVVar6->pArray = pcVar7;
            pVVar6->nCap = 0x10;
          }
          else {
            sVar3 = (ulong)uVar2 * 2;
            if (pVVar6->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(sVar3);
            }
            else {
              pcVar7 = (char *)realloc(pVVar6->pArray,sVar3);
            }
            pVVar6->pArray = pcVar7;
            pVVar6->nCap = (int)sVar3;
            p = local_58;
          }
        }
        else {
          pcVar7 = pVVar6->pArray;
        }
        pVVar6->nSize = uVar2 + 1;
        pcVar7[(int)uVar2] = (char)iVar14;
        if (iVar14 == 1) {
          p->nSatUnsat = p->nSatUnsat + 1;
          p->nConfUnsat = p->nConfUnsat + (p->Pars).nBTThis;
          iVar5 = clock_gettime(3,&local_80);
          if (iVar5 < 0) {
            lVar12 = -1;
          }
          else {
            lVar12 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
          }
          p->timeSatUnsat = p->timeSatUnsat + lVar12 + lVar11;
          pAig = local_68;
        }
        else if (iVar14 == -1) {
          p->nSatUndec = p->nSatUndec + 1;
          p->nConfUndec = p->nConfUndec + (p->Pars).nBTThis;
          Cec_ManSatAddToStore(local_60,(Vec_Int_t *)0x0,iVar5);
          iVar5 = clock_gettime(3,&local_80);
          if (iVar5 < 0) {
            lVar12 = -1;
          }
          else {
            lVar12 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
          }
          p->timeSatUndec = p->timeSatUndec + lVar12 + lVar11;
          pAig = local_68;
        }
        else {
          p->nSatSat = p->nSatSat + 1;
          p->nConfSat = p->nConfSat + (p->Pars).nBTThis;
          Cec_ManSatAddToStore(local_60,local_50,iVar5);
          iVar5 = clock_gettime(3,&local_80);
          if (iVar5 < 0) {
            lVar12 = -1;
          }
          else {
            lVar12 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
          }
          p->timeSatSat = p->timeSatSat + lVar12 + lVar11;
          pAig = local_68;
        }
      }
      lVar10 = lVar10 + 1;
      pVVar13 = pAig->vCos;
    } while (lVar10 < pVVar13->nSize);
    __ptr_00 = (void *)local_38[1];
    __ptr = local_38;
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
    pVVar13 = pAig->vCos;
  }
  free(__ptr);
  p->nSatTotal = pVVar13->nSize - pAig->nRegs;
  iVar5 = clock_gettime(3,&local_80);
  ppVVar4 = local_40;
  if (iVar5 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
  }
  p->timeTotal = lVar10 + local_48;
  if (local_6c != 0) {
    Tas_ManSatPrintStats(p);
  }
  Tas_ManStop(p);
  *ppVVar4 = pVVar6;
  return local_60;
}

Assistant:

Vec_Int_t * Tas_ManSolveMiterNc( Gia_Man_t * pAig, int nConfs, Vec_Str_t ** pvStatus, int fVerbose )
{
    extern void Gia_ManCollectTest( Gia_Man_t * pAig );
    extern void Cec_ManSatAddToStore( Vec_Int_t * vCexStore, Vec_Int_t * vCex, int Out );
    Tas_Man_t * p; 
    Vec_Int_t * vCex, * vVisit, * vCexStore;
    Vec_Str_t * vStatus;
    Gia_Obj_t * pRoot;//, * pRootCopy; 
//    Gia_Man_t * pAigCopy = Gia_ManDup( pAig ), * pAigTemp;

    int i, status;
    abctime clk, clkTotal = Abc_Clock();
    assert( Gia_ManRegNum(pAig) == 0 );
//    Gia_ManCollectTest( pAig );
    // prepare AIG
    Gia_ManCreateRefs( pAig );
    Gia_ManCleanMark0( pAig );
    Gia_ManCleanMark1( pAig );
    Gia_ManFillValue( pAig ); // maps nodes into trail ids
    Gia_ManCleanPhase( pAig ); // maps nodes into trail ids
    // create logic network
    p = Tas_ManAlloc( pAig, nConfs );
    p->pAig   = pAig;
    // create resulting data-structures
    vStatus   = Vec_StrAlloc( Gia_ManPoNum(pAig) );
    vCexStore = Vec_IntAlloc( 10000 );
    vVisit    = Vec_IntAlloc( 100 );
    vCex      = Tas_ReadModel( p );
    // solve for each output
    Gia_ManForEachCo( pAig, pRoot, i )
    {
//        printf( "%d=", i );

        Vec_IntClear( vCex );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pRoot)) )
        {
            if ( Gia_ObjFaninC0(pRoot) )
            {
//                printf( "Constant 1 output of SRM!!!\n" );
                Cec_ManSatAddToStore( vCexStore, vCex, i ); // trivial counter-example
                Vec_StrPush( vStatus, 0 );
            }
            else
            {
//                printf( "Constant 0 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 1 );
            }
            continue;
        } 
        clk = Abc_Clock();
//        p->Pars.fUseActive  = 1;
        p->Pars.fUseHighest = 1;
        p->Pars.fUseLowest  = 0;
        status = Tas_ManSolve( p, Gia_ObjChild0(pRoot), NULL );
//        printf( "\n" );
/*
        if ( status == -1 )
        {
            p->Pars.fUseHighest = 0;
            p->Pars.fUseLowest  = 1;
            status = Tas_ManSolve( p, Gia_ObjChild0(pRoot) );
        }
*/
        Vec_StrPush( vStatus, (char)status );
        if ( status == -1 )
        {
//            printf( "Unsolved %d.\n", i );

            p->nSatUndec++;
            p->nConfUndec += p->Pars.nBTThis;
            Cec_ManSatAddToStore( vCexStore, NULL, i ); // timeout
            p->timeSatUndec += Abc_Clock() - clk;
            continue;
        }

//        pRootCopy = Gia_ManCo( pAigCopy, i );
//        pRootCopy->iDiff0 = Gia_ObjId( pAigCopy, pRootCopy );
//        pRootCopy->fCompl0 = 0;

        if ( status == 1 )
        {
            p->nSatUnsat++;
            p->nConfUnsat += p->Pars.nBTThis;
            p->timeSatUnsat += Abc_Clock() - clk;
            continue;
        }
        p->nSatSat++;
        p->nConfSat += p->Pars.nBTThis;
//        Gia_SatVerifyPattern( pAig, pRoot, vCex, vVisit );
        Cec_ManSatAddToStore( vCexStore, vCex, i );
        p->timeSatSat += Abc_Clock() - clk;

//        printf( "%d ", Vec_IntSize(vCex) );
    }
//    pAigCopy = Gia_ManCleanup( pAigTemp = pAigCopy );
//    Gia_ManStop( pAigTemp );
//    Gia_DumpAiger( pAigCopy, "test", 0, 2 );
//    Gia_ManStop( pAigCopy );

    Vec_IntFree( vVisit );
    p->nSatTotal = Gia_ManPoNum(pAig);
    p->timeTotal = Abc_Clock() - clkTotal;
    if ( fVerbose )
        Tas_ManSatPrintStats( p );
//    printf( "RecCalls = %8d.  RecClause = %8d.  RecNonChro = %8d.\n", p->nRecCall, p->nRecClause, p->nRecNonChro );
    Tas_ManStop( p );
    *pvStatus = vStatus;

//    printf( "Total number of cex literals = %d. (Ave = %d)\n", 
//         Vec_IntSize(vCexStore)-2*p->nSatUndec-2*p->nSatSat, 
//        (Vec_IntSize(vCexStore)-2*p->nSatUndec-2*p->nSatSat)/p->nSatSat );
    return vCexStore;
}